

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  long lVar1;
  allocator local_51;
  string local_50;
  
  for (lVar1 = 8; lVar1 != 0x68; lVar1 = lVar1 + 0x10) {
    if (*(int *)((long)&__dso_handle + lVar1) == sig) {
      std::__cxx11::string::string
                ((string *)&local_50,*(char **)((long)&signalDefs + lVar1),&local_51);
      fatal(&local_50,-sig);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::__cxx11::string::string((string *)&local_50,"<unknown signal>",&local_51);
  fatal(&local_50,-sig);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

static void handleSignal( int sig ) {
            for( std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i )
                if( sig == signalDefs[i].id )
                    fatal( signalDefs[i].name, -sig );
            fatal( "<unknown signal>", -sig );
        }